

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

string * __thiscall
libtorrent::bdecode_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,bdecode_error_category *this,int ev)

{
  char *__s;
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  int local_1c;
  bdecode_error_category *pbStack_18;
  int ev_local;
  bdecode_error_category *this_local;
  
  local_1c = ev;
  pbStack_18 = this;
  this_local = (bdecode_error_category *)__return_storage_ptr__;
  if ((ev < 0) || (7 < ev)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown error",&local_1d);
    ::std::allocator<char>::~allocator(&local_1d);
  }
  else {
    __s = message::msgs[ev];
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_2d);
    ::std::allocator<char>::~allocator(local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string bdecode_error_category::message(int ev) const
	{
		static char const* msgs[] =
		{
			"no error",
			"expected digit in bencoded string",
			"expected colon in bencoded string",
			"unexpected end of file in bencoded string",
			"expected value (list, dict, int or string) in bencoded string",
			"bencoded nesting depth exceeded",
			"bencoded item count limit exceeded",
			"integer overflow",
		};
		if (ev < 0 || ev >= int(sizeof(msgs)/sizeof(msgs[0])))
			return "Unknown error";
		return msgs[ev];
	}